

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O0

bool isWordChar(int c)

{
  bool local_9;
  int c_local;
  
  if ((((c == 0) || (c - 9U < 2)) || (c == 0xd)) || (((c == 0x20 || (c == 0x24)) || (c == 0x3a)))) {
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

static bool isWordChar(int c) {
  switch (c) {
  case '\0':
  case '\t':
  case '\r':
  case '\n':
  case ' ':
  case '$':
  case ':':
    return false;
  default:
    return true;
  }
}